

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::Print
          (Printer *this,Message *message,TextGenerator *generator)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UnknownFieldSet *unknown_fields;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  long *plVar4;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
  iVar2 = std::__cxx11::string::compare(*(char **)(CONCAT44(extraout_var,iVar2) + 8));
  if ((((iVar2 != 0) || (this->expand_any_ != true)) ||
      (bVar1 = PrintAny(this,message,generator), !bVar1)) &&
     ((**(code **)(*plVar4 + 0x80))(plVar4,message), this->hide_unknown_fields_ == false)) {
    unknown_fields = (UnknownFieldSet *)(**(code **)(*plVar4 + 0x10))(plVar4,message);
    PrintUnknownFields(this,unknown_fields,generator);
  }
  return;
}

Assistant:

void TextFormat::Printer::Print(const Message& message,
                                TextGenerator& generator) const {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = message.GetReflection();
  if (descriptor->full_name() == internal::kAnyFullTypeName && expand_any_ &&
      PrintAny(message, generator)) {
    return;
  }
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);
  if (print_message_fields_in_index_order_) {
    std::sort(fields.begin(), fields.end(), FieldIndexSorter());
  }
  for (int i = 0; i < fields.size(); i++) {
    PrintField(message, reflection, fields[i], generator);
  }
  if (!hide_unknown_fields_) {
    PrintUnknownFields(reflection->GetUnknownFields(message), generator);
  }
}